

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int fileext_compare(char *test_ext,char *known_ext)

{
  int iVar1;
  size_t sVar2;
  int cmp;
  size_t len;
  size_t c;
  char caps [8];
  char *known_ext_local;
  char *test_ext_local;
  
  caps = (char  [8])known_ext;
  memset(&c,0,8);
  test_ext_local._4_4_ = strcmp(test_ext,(char *)caps);
  if ((((test_ext_local._4_4_ != 0) && (test_ext != (char *)0x0)) && (caps != (char  [8])0x0)) &&
     (sVar2 = strlen((char *)caps), sVar2 < 8)) {
    for (len = 0; len < sVar2; len = len + 1) {
      iVar1 = toupper((int)*(char *)((long)caps + len));
      caps[len - 8] = (char)iVar1;
    }
    caps[len - 8] = '\0';
    test_ext_local._4_4_ = strcmp(test_ext,(char *)&c);
  }
  return test_ext_local._4_4_;
}

Assistant:

static int fileext_compare(const char * test_ext, const char * known_ext)
{
   char caps[8] = "";
   size_t c,len;
   /* if equal, don't need to check case (store to avoid multiple calls) */
   const int cmp = strcmp(test_ext, known_ext);
   if( cmp == 0 ) return cmp;

   /* if anything odd, use default */
   if( !test_ext || !known_ext ) return cmp;

   len = strlen(known_ext);
   if( len > 7 ) return cmp;

   /* if here, strings are different but need to check upper-case */

   for(c = 0; c < len; c++ ) caps[c] = toupper((int) known_ext[c]);
   caps[c] = '\0';

   return strcmp(test_ext, caps);
}